

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmProcessTools.cxx
# Opt level: O0

void cmProcessTools::RunProcess
               (cmsysProcess_s *cp,OutputParser *out,OutputParser *err,Encoding encoding)

{
  OutputParser *pOVar1;
  int iVar2;
  ulong uVar3;
  char *pcVar4;
  bool bVar5;
  string local_b0;
  string local_90;
  undefined1 local_60 [8];
  string strdata;
  int local_38;
  int iStack_34;
  cmProcessOutput processOutput;
  int p;
  int length;
  char *data;
  OutputParser *pOStack_20;
  Encoding encoding_local;
  OutputParser *err_local;
  OutputParser *out_local;
  cmsysProcess_s *cp_local;
  
  data._4_4_ = encoding;
  pOStack_20 = err;
  err_local = out;
  out_local = (OutputParser *)cp;
  cmsysProcess_Execute(cp);
  _p = (char *)0x0;
  iStack_34 = 0;
  cmProcessOutput::cmProcessOutput
            ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),data._4_4_,0x400);
  std::__cxx11::string::string((string *)local_60);
  while( true ) {
    if ((err_local != (OutputParser *)0x0) || (bVar5 = false, pOStack_20 != (OutputParser *)0x0)) {
      local_38 = cmsysProcess_WaitForData
                           ((cmsysProcess *)out_local,(char **)&p,&stack0xffffffffffffffcc,
                            (double *)0x0);
      bVar5 = local_38 != 0;
    }
    if (!bVar5) break;
    if ((err_local == (OutputParser *)0x0) || (local_38 != 2)) {
      if ((pOStack_20 != (OutputParser *)0x0) && (local_38 == 3)) {
        cmProcessOutput::DecodeText
                  ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),_p,(long)iStack_34,
                   (string *)local_60,2);
        pOVar1 = pOStack_20;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        iVar2 = std::__cxx11::string::size();
        bVar5 = OutputParser::Process(pOVar1,pcVar4,iVar2);
        if (!bVar5) {
          pOStack_20 = (OutputParser *)0x0;
        }
      }
    }
    else {
      cmProcessOutput::DecodeText
                ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),_p,(long)iStack_34,
                 (string *)local_60,1);
      pOVar1 = err_local;
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iVar2 = std::__cxx11::string::size();
      bVar5 = OutputParser::Process(pOVar1,pcVar4,iVar2);
      if (!bVar5) {
        err_local = (OutputParser *)0x0;
      }
    }
  }
  if (err_local != (OutputParser *)0x0) {
    std::__cxx11::string::string((string *)&local_90);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),&local_90,(string *)local_60,
               1);
    std::__cxx11::string::~string((string *)&local_90);
    uVar3 = std::__cxx11::string::empty();
    pOVar1 = err_local;
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iVar2 = std::__cxx11::string::size();
      OutputParser::Process(pOVar1,pcVar4,iVar2);
    }
  }
  if (pOStack_20 != (OutputParser *)0x0) {
    std::__cxx11::string::string((string *)&local_b0);
    cmProcessOutput::DecodeText
              ((cmProcessOutput *)(strdata.field_2._M_local_buf + 0xf),&local_b0,(string *)local_60,
               2);
    std::__cxx11::string::~string((string *)&local_b0);
    uVar3 = std::__cxx11::string::empty();
    pOVar1 = pOStack_20;
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::c_str();
      iVar2 = std::__cxx11::string::size();
      OutputParser::Process(pOVar1,pcVar4,iVar2);
    }
  }
  cmsysProcess_WaitForExit((cmsysProcess *)out_local,(double *)0x0);
  std::__cxx11::string::~string((string *)local_60);
  return;
}

Assistant:

void cmProcessTools::RunProcess(struct cmsysProcess_s* cp, OutputParser* out,
                                OutputParser* err, Encoding encoding)
{
  cmsysProcess_Execute(cp);
  char* data = nullptr;
  int length = 0;
  int p;
  cmProcessOutput processOutput(encoding);
  std::string strdata;
  while ((out || err) &&
         (p = cmsysProcess_WaitForData(cp, &data, &length, nullptr))) {
    if (out && p == cmsysProcess_Pipe_STDOUT) {
      processOutput.DecodeText(data, length, strdata, 1);
      if (!out->Process(strdata.c_str(), static_cast<int>(strdata.size()))) {
        out = nullptr;
      }
    } else if (err && p == cmsysProcess_Pipe_STDERR) {
      processOutput.DecodeText(data, length, strdata, 2);
      if (!err->Process(strdata.c_str(), static_cast<int>(strdata.size()))) {
        err = nullptr;
      }
    }
  }
  if (out) {
    processOutput.DecodeText(std::string(), strdata, 1);
    if (!strdata.empty()) {
      out->Process(strdata.c_str(), static_cast<int>(strdata.size()));
    }
  }
  if (err) {
    processOutput.DecodeText(std::string(), strdata, 2);
    if (!strdata.empty()) {
      err->Process(strdata.c_str(), static_cast<int>(strdata.size()));
    }
  }
  cmsysProcess_WaitForExit(cp, nullptr);
}